

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

string * __thiscall minja::Value::to_str_abi_cxx11_(Value *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  Value *unaff_retaddr;
  Value *in_stack_00000018;
  bool in_stack_00000153;
  int in_stack_00000154;
  Value *in_stack_00000158;
  Value *in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  allocator<char> local_25 [5];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  string *__val;
  
  __val = in_RDI;
  bVar1 = is_string((Value *)0x2ae2fa);
  if (bVar1) {
    get<std::__cxx11::string>(in_stack_00000018);
  }
  else {
    bVar1 = is_number_integer((Value *)0x2ae31e);
    if (bVar1) {
      get<long>(unaff_retaddr);
      std::__cxx11::to_string((long)__val);
    }
    else {
      bVar1 = is_number_float((Value *)0x2ae34a);
      if (bVar1) {
        get<double>(unaff_retaddr);
        std::__cxx11::to_string(in_stack_ffffffffffffffb8);
      }
      else {
        bVar1 = is_boolean((Value *)0x2ae373);
        if (bVar1) {
          get<bool>(unaff_retaddr);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
        }
        else {
          bVar1 = is_null(in_stack_ffffffffffffffb0);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
            std::allocator<char>::~allocator(local_25);
          }
          else {
            dump_abi_cxx11_(in_stack_00000158,in_stack_00000154,in_stack_00000153);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string to_str() const {
    if (is_string()) return get<std::string>();
    if (is_number_integer()) return std::to_string(get<int64_t>());
    if (is_number_float()) return std::to_string(get<double>());
    if (is_boolean()) return get<bool>() ? "True" : "False";
    if (is_null()) return "None";
    return dump();
  }